

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::WATParser::TableType> *
wasm::WATParser::tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::TableType> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          Type addressType)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Storage<unsigned_long,_true> _Var3;
  _Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *p_Var4;
  undefined1 auStack_c0 [8];
  Result<wasm::WATParser::Limits> limits;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val_1;
  
  if (addressType.id == 2) {
    limits32<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::Limits> *)auStack_c0,ctx);
  }
  else {
    limits64<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::Limits> *)auStack_c0,ctx);
  }
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)local_78,
                  (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_c0);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_78,
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_78);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> = puVar2;
    if ((undefined1 *)
        type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> =
           type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10)
           = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 8) =
         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20) = '\x01';
    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = puVar1;
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)local_78);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)local_78);
    reftype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_78,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_78);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_ = &local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20),
                 type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                 _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                 type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> = puVar2;
      if ((undefined1 *)
          limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_ == &local_88) {
        *puVar2 = CONCAT71(uStack_87,local_88);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x18) =
             uStack_80;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> =
             limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10
                  ) = CONCAT71(uStack_87,local_88);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 8) = local_90;
      local_88 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20) = '\x01';
      limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_ = &local_88;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)0x0;
      if (limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_c0;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x18) =
           *(undefined8 *)
            ((long)&(p_Var4->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u.
                    _M_first._M_storage.max.super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long> + 8);
      _Var3 = (p_Var4->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u.
              _M_first._M_storage.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload;
      *(uint64_t *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 8) =
           (p_Var4->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u._M_first.
           _M_storage.initial;
      *(_Storage<unsigned_long,_true> *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10) = _Var3;
      *(uintptr_t *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> = addressType.id;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_78);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletypeContinued(Ctx& ctx,
                                                    Type addressType) {
  auto limits = addressType == Type::i32 ? limits32(ctx) : limits64(ctx);
  CHECK_ERR(limits);
  auto type = reftype(ctx);
  CHECK_ERR(type);
  return ctx.makeTableType(addressType, *limits, *type);
}